

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpack.cpp
# Opt level: O3

void __thiscall CharConvHex::putch(CharConvHex *this,char **buf,wchar_t ch,int idx,int pct)

{
  byte *pbVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  
  iVar4 = 0;
  if (((uint)ch < 0x80) &&
     ((0xfffffff5 < (uint)(ch + L'\xffffffc6') ||
      (((uint)(ch + L'\xffffffbf') < 0x26 &&
       ((0x3f0000003fU >> ((ulong)(uint)(ch + L'\xffffffbf') & 0x3f) & 1) != 0)))))) {
    iVar3 = -0x30;
    if (0x40 < (uint)ch) {
      iVar3 = -0x37;
    }
    iVar4 = -0x57;
    if ((uint)ch < 0x61) {
      iVar4 = iVar3;
    }
    iVar4 = iVar4 + ch;
  }
  bVar2 = (**(code **)(*(long *)this + 0x50))(this,iVar4,idx & 1);
  if ((idx & 1U) == 0) {
    **buf = bVar2;
  }
  else {
    pbVar1 = (byte *)*buf;
    *buf = (char *)(pbVar1 + 1);
    *pbVar1 = *pbVar1 | bVar2;
  }
  return;
}

Assistant:

virtual void putch(char *&buf, wchar_t ch, int idx, int pct)
    {
        /* get the nibble value from the character */
        int d = is_xdigit(ch) ? value_of_xdigit(ch) : 0;
        int n = nibble_to_byte(d, idx & 1);

        /* 
         *   if this is an even index, it's the first nibble of the byte, so
         *   set the whole byte to the nibble value; if it's an odd index,
         *   it's the second nibble for the byte, so OR it into the byte and
         *   increment the output pointer 
         */
        if (idx & 1)
            *buf++ |= (char)n;
        else
            *buf = (char)n;
    }